

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

bool __thiscall
MakefileGenerator::verifyExtraCompiler
          (MakefileGenerator *this,ProString *comp,QString *file_unfixed)

{
  char16_t cVar1;
  QMakeProject *pQVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  QList<ProString> *pQVar6;
  qsizetype qVar7;
  ProStringList *pPVar8;
  char16_t *pcVar9;
  ulong uVar10;
  ProStringList *pPVar11;
  ProString *pPVar12;
  ProString *pPVar13;
  ulong uVar14;
  ProString *pPVar15;
  long in_FS_OFFSET;
  ProString local_218;
  QArrayDataPointer<ProString> local_1e0;
  QArrayDataPointer<char16_t> local_1c8;
  QArrayDataPointer<char16_t> local_1b0;
  QArrayDataPointer<char16_t> local_198;
  QArrayDataPointer<ProString> local_180;
  QArrayDataPointer<ProStringList> local_168;
  QArrayDataPointer<ProString> local_148;
  QArrayDataPointer<ProString> local_128;
  ProString local_108;
  QArrayDataPointer<ProString> local_d8;
  ProString verify;
  ProString tmp_out;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->no_io != false) {
    bVar4 = false;
    goto LAB_00144b3d;
  }
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  Option::normalizePath((QString *)&local_58,file_unfixed,true,true);
  pQVar2 = this->project;
  verify.m_string.d.ptr = L".CONFIG";
  verify.m_string.d.d = (Data *)comp;
  ProString::ProString<ProString_const&,char_const(&)[8]>
            (&tmp_out,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&verify);
  pQVar6 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&tmp_out)->
            super_QList<ProString>;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp_out);
  qVar7 = QtPrivate::indexOf<ProString,char[11]>(pQVar6,(char (*) [11])"moc_verify",0);
  if (qVar7 == -1) {
    qVar7 = QtPrivate::indexOf<ProString,char[16]>(pQVar6,(char (*) [16])"function_verify",0);
    if (qVar7 == -1) {
      qVar7 = QtPrivate::indexOf<ProString,char[7]>(pQVar6,(char (*) [7])0x21ad05,0);
      if (qVar7 == -1) {
LAB_00144df8:
        bVar4 = true;
        goto LAB_00144b30;
      }
      local_108.m_string.d.size = -0x5555555555555556;
      local_108.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_108.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      pQVar2 = this->project;
      local_218.m_string.d.ptr = L".output";
      local_218.m_string.d.d = (Data *)comp;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                (&verify,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_218);
      QMakeEvaluator::first(&tmp_out,&pQVar2->super_QMakeEvaluator,(ProKey *)&verify);
      ProString::toQString(&local_108.m_string,&tmp_out);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp_out);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&verify);
      if (local_108.m_string.d.size != 0) {
        verify.m_string.d.size = -0x5555555555555556;
        verify.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        verify.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        pQVar2 = this->project;
        local_218.m_string.d.ptr = L".commands";
        local_218.m_string.d.d = (Data *)comp;
        ProString::ProString<ProString_const&,char_const(&)[10]>
                  (&tmp_out,(QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)&local_218);
        pPVar8 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&tmp_out);
        ProStringList::join(&verify.m_string,pPVar8,(QChar)0x20);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp_out);
        qVar7 = QtPrivate::indexOf<ProString,char[8]>(pQVar6,(char (*) [8])"combine",0);
        if (qVar7 != -1) {
          tmp_out.m_string.d.size = -0x5555555555555556;
          tmp_out.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          tmp_out.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_218.m_string.d.d = (Data *)0x0;
          local_218.m_string.d.ptr = (char16_t *)0x0;
          local_218.m_string.d.size = 0;
          pPVar13 = &local_108;
          replaceExtraCompilerVariables
                    (&tmp_out.m_string,this,&verify.m_string,&local_218.m_string,&pPVar13->m_string,
                     LocalShell);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_218)
          ;
          QString::toLatin1_helper((QString *)&local_218);
          pcVar9 = local_218.m_string.d.ptr;
          if (local_218.m_string.d.ptr == (char16_t *)0x0) {
            pcVar9 = (char16_t *)&QByteArray::_empty;
          }
          iVar5 = system((char *)pcVar9);
          bVar4 = iVar5 == 0;
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_218);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp_out);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&verify);
          goto LAB_001443b4;
        }
        pQVar2 = this->project;
        local_218.m_string.d.ptr = L".input";
        local_218.m_string.d.d = (Data *)comp;
        ProString::ProString<ProString_const&,char_const(&)[7]>
                  (&tmp_out,(QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_218);
        pPVar8 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&tmp_out);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp_out);
        pPVar13 = (pPVar8->super_QList<ProString>).d.ptr;
        pPVar12 = pPVar13;
        while( true ) {
          bVar4 = pPVar12 == pPVar13 + (pPVar8->super_QList<ProString>).d.size;
          if (bVar4) break;
          pPVar11 = QMakeEvaluator::valuesRef
                              (&this->project->super_QMakeEvaluator,(ProKey *)pPVar12);
          pPVar13 = (pPVar11->super_QList<ProString>).d.ptr;
          for (pPVar15 = pPVar13; pPVar15 != pPVar13 + (pPVar11->super_QList<ProString>).d.size;
              pPVar15 = pPVar15 + 1) {
            if (pPVar15->m_length != 0) {
              tmp_out.m_string.d.size = -0x5555555555555556;
              tmp_out.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              tmp_out.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              ProString::toQString(&tmp_out.m_string,pPVar15);
              local_218.m_string.d.size = -0x5555555555555556;
              local_218.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_218.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              fileFixify(&local_218.m_string,this,&tmp_out.m_string,(FileFixifyTypes)0x0,true);
              bVar3 = comparesEqual(&local_218.m_string,(QString *)&local_58);
              if (bVar3) {
                local_d8.size = 0xaaaaaaaaaaaaaaaa;
                local_d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
                local_d8.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
                local_128.d = (Data *)0x0;
                local_128.ptr = (ProString *)0x0;
                local_128.size = 0;
                replaceExtraCompilerVariables
                          ((QString *)&local_d8,this,&local_108.m_string,&tmp_out.m_string,
                           (QString *)&local_128,NoShell);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_128);
                local_128.size = -0x5555555555555556;
                local_128.d = (Data *)0xaaaaaaaaaaaaaaaa;
                local_128.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
                replaceExtraCompilerVariables
                          ((QString *)&local_128,this,&verify.m_string,&local_218.m_string,
                           (QString *)&local_d8,LocalShell);
                QString::toLatin1_helper((QString *)&local_148);
                pPVar13 = local_148.ptr;
                if (local_148.ptr == (ProString *)0x0) {
                  pPVar13 = (ProString *)&QByteArray::_empty;
                }
                iVar5 = system((char *)pPVar13);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_148);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_128);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_d8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_218);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&tmp_out);
                if (iVar5 != 0) goto LAB_00144dbb;
                break;
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_218);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&tmp_out);
              pPVar13 = (pPVar11->super_QList<ProString>).d.ptr;
            }
          }
          pPVar12 = pPVar12 + 1;
          pPVar13 = (pPVar8->super_QList<ProString>).d.ptr;
        }
LAB_00144dbb:
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&verify);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_108);
        goto LAB_00144b30;
      }
      pPVar13 = &local_108;
    }
    else {
      tmp_out.m_file = -0x55555556;
      tmp_out._36_4_ = 0xaaaaaaaa;
      tmp_out.m_hash = 0xaaaaaaaaaaaaaaaa;
      tmp_out.m_string.d.size = -0x5555555555555556;
      tmp_out.m_offset = -0x55555556;
      tmp_out.m_length = -0x55555556;
      tmp_out.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      tmp_out.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      pQVar2 = this->project;
      local_108.m_string.d.ptr = L".output";
      local_108.m_string.d.d = (Data *)comp;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                (&verify,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_108);
      QMakeEvaluator::first(&tmp_out,&pQVar2->super_QMakeEvaluator,(ProKey *)&verify);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&verify);
      if (tmp_out.m_length != 0) {
        pQVar2 = this->project;
        local_108.m_string.d.ptr = L".verify_function";
        local_108.m_string.d.d = (Data *)comp;
        ProString::ProString<ProString_const&,char_const(&)[17]>
                  (&verify,(QStringBuilder<const_ProString_&,_const_char_(&)[17]> *)&local_108);
        pPVar8 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&verify);
        local_d8.d = (pPVar8->super_QList<ProString>).d.d;
        local_d8.ptr = (pPVar8->super_QList<ProString>).d.ptr;
        uVar14 = (pPVar8->super_QList<ProString>).d.size;
        if (local_d8.d != (Data *)0x0) {
          LOCK();
          ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_d8.size = uVar14;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&verify);
        if (uVar14 != 0) {
          uVar10 = 0;
          while( true ) {
            if (uVar14 <= uVar10) break;
            verify.m_file = -0x55555556;
            verify._36_4_ = 0xaaaaaaaa;
            verify.m_hash = 0xaaaaaaaaaaaaaaaa;
            verify.m_string.d.size = -0x5555555555555556;
            verify.m_offset = -0x55555556;
            verify.m_length = -0x55555556;
            verify.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            verify.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            ProString::ProString(&verify,local_d8.ptr + uVar10);
            pcVar9 = verify.m_string.d.ptr;
            if (verify.m_string.d.ptr == (char16_t *)0x0) {
              pcVar9 = (char16_t *)&QString::_empty;
            }
            cVar1 = pcVar9[verify.m_offset];
            if (cVar1 == L'!') {
              ProString::mid(&local_108,&verify,1,-1);
              ProString::operator=(&verify,&local_108);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_108);
            }
            qVar7 = QtPrivate::indexOf<ProString,char[8]>(pQVar6,(char (*) [8])"combine",0);
            pQVar2 = this->project;
            if (qVar7 == -1) {
              local_218.m_string.d.ptr = L".input";
              local_218.m_string.d.d = (Data *)comp;
              ProString::ProString<ProString_const&,char_const(&)[7]>
                        (&local_108,
                         (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_218);
              pPVar8 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_108)
              ;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_108);
              pPVar13 = (pPVar8->super_QList<ProString>).d.ptr;
              for (pPVar12 = pPVar13; pPVar12 != pPVar13 + (pPVar8->super_QList<ProString>).d.size;
                  pPVar12 = pPVar12 + 1) {
                pPVar11 = QMakeEvaluator::valuesRef
                                    (&this->project->super_QMakeEvaluator,(ProKey *)pPVar12);
                pPVar13 = (pPVar11->super_QList<ProString>).d.ptr;
                for (pPVar15 = pPVar13;
                    pPVar15 != pPVar13 + (pPVar11->super_QList<ProString>).d.size;
                    pPVar15 = pPVar15 + 1) {
                  if (pPVar15->m_length != 0) {
                    local_128.size = -0x5555555555555556;
                    local_128.d = (Data *)0xaaaaaaaaaaaaaaaa;
                    local_128.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
                    ProString::toQString((QString *)&local_128,pPVar15);
                    local_148.size = -0x5555555555555556;
                    local_148.d = (Data *)0xaaaaaaaaaaaaaaaa;
                    local_148.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
                    fileFixify((QString *)&local_148,this,(QString *)&local_128,(FileFixifyTypes)0x0
                               ,true);
                    bVar4 = comparesEqual((QString *)&local_148,(QString *)&local_58);
                    if (bVar4) {
                      pQVar2 = this->project;
                      local_168.d = (Data *)0x0;
                      local_168.ptr = (ProStringList *)0x0;
                      local_168.size = 0;
                      ProString::toQString((QString *)&local_1b0,&tmp_out);
                      local_1c8.d = (Data *)0x0;
                      local_1c8.ptr = (char16_t *)0x0;
                      local_1c8.size = 0;
                      replaceExtraCompilerVariables
                                ((QString *)&local_198,this,(QString *)&local_1b0,
                                 (QString *)&local_128,(QString *)&local_1c8,NoShell);
                      ProString::ProString(&local_108,(QString *)&local_198);
                      ProStringList::ProStringList((ProStringList *)&local_180,&local_108);
                      QList<ProStringList>::emplaceBack<ProStringList>
                                ((QList<ProStringList> *)&local_168,(ProStringList *)&local_180);
                      ProString::ProString(&local_218,(QString *)&local_58);
                      ProStringList::ProStringList((ProStringList *)&local_1e0,&local_218);
                      QList<ProStringList>::emplaceBack<ProStringList>
                                ((QList<ProStringList> *)&local_168,(ProStringList *)&local_1e0);
                      bVar4 = QMakeProject::test(pQVar2,(ProKey *)&verify,
                                                 (QList<ProStringList> *)&local_168);
                      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1e0);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_218);
                      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_180);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_108);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b0);
                      QArrayDataPointer<ProStringList>::~QArrayDataPointer(&local_168);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_148);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&local_128);
                      if (bVar4 == (cVar1 == L'!')) goto LAB_00144b07;
                      break;
                    }
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_148);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_128);
                    pPVar13 = (pPVar11->super_QList<ProString>).d.ptr;
                  }
                }
                pPVar13 = (pPVar8->super_QList<ProString>).d.ptr;
              }
            }
            else {
              local_218.m_string.d.d = (Data *)0x0;
              local_218.m_string.d.ptr = (char16_t *)0x0;
              local_218.m_string.d.size = 0;
              ProStringList::ProStringList((ProStringList *)&local_128,&tmp_out);
              QList<ProStringList>::emplaceBack<ProStringList>
                        ((QList<ProStringList> *)&local_218,(ProStringList *)&local_128);
              ProString::ProString(&local_108,(QString *)&local_58);
              ProStringList::ProStringList((ProStringList *)&local_148,&local_108);
              QList<ProStringList>::emplaceBack<ProStringList>
                        ((QList<ProStringList> *)&local_218,(ProStringList *)&local_148);
              bVar4 = QMakeProject::test(pQVar2,(ProKey *)&verify,(QList<ProStringList> *)&local_218
                                        );
              QArrayDataPointer<ProString>::~QArrayDataPointer(&local_148);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_108);
              QArrayDataPointer<ProString>::~QArrayDataPointer(&local_128);
              QArrayDataPointer<ProStringList>::~QArrayDataPointer
                        ((QArrayDataPointer<ProStringList> *)&local_218);
              if (bVar4 == (cVar1 == L'!')) {
LAB_00144b07:
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&verify);
                goto LAB_00144b14;
              }
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&verify);
            uVar10 = uVar10 + 1;
            uVar14 = local_d8.size;
          }
          QArrayDataPointer<ProString>::~QArrayDataPointer(&local_d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp_out);
          goto LAB_00144df8;
        }
LAB_00144b14:
        QArrayDataPointer<ProString>::~QArrayDataPointer(&local_d8);
      }
      pPVar13 = &tmp_out;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pPVar13);
LAB_00144b2e:
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (local_58.ptr != (char16_t *)0x0) {
      QMakeSourceFileInfo::addSourceFile
                (&this->super_QMakeSourceFileInfo,(QString *)&local_58,'\x02',TYPE_C);
      bVar3 = QMakeSourceFileInfo::mocable(&this->super_QMakeSourceFileInfo,(QString *)&local_58);
      if (!bVar3) goto LAB_00144b2e;
      pQVar2 = this->project;
      pPVar13 = &tmp_out;
      ProKey::ProKey((ProKey *)pPVar13,"MOCABLES");
      pQVar6 = &QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)pPVar13)->
                super_QList<ProString>;
      ProString::ProString(&verify,(QString *)&local_58);
      QList<ProString>::emplaceBack<ProString>(pQVar6,&verify);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&verify);
LAB_001443b4:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pPVar13);
    }
  }
LAB_00144b30:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_00144b3d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool
MakefileGenerator::verifyExtraCompiler(const ProString &comp, const QString &file_unfixed)
{
    if(noIO())
        return false;
    const QString file = Option::normalizePath(file_unfixed);

    const ProStringList &config = project->values(ProKey(comp + ".CONFIG"));
    if (config.indexOf("moc_verify") != -1) {
        if(!file.isNull()) {
            QMakeSourceFileInfo::addSourceFile(file, QMakeSourceFileInfo::SEEK_MOCS);
            if(!mocable(file)) {
                return false;
            } else {
                project->values("MOCABLES").append(file);
            }
        }
    } else if (config.indexOf("function_verify") != -1) {
        ProString tmp_out = project->first(ProKey(comp + ".output"));
        if(tmp_out.isEmpty())
            return false;
        ProStringList verify_function = project->values(ProKey(comp + ".verify_function"));
        if(verify_function.isEmpty())
            return false;

        for(int i = 0; i < verify_function.size(); ++i) {
            bool invert = false;
            ProString verify = verify_function.at(i);
            if(verify.at(0) == QLatin1Char('!')) {
                invert = true;
                verify = verify.mid(1);
            }

            if (config.indexOf("combine") != -1) {
                bool pass = project->test(verify.toKey(), QList<ProStringList>() << ProStringList(tmp_out) << ProStringList(file));
                if(invert)
                    pass = !pass;
                if(!pass)
                    return false;
            } else {
                const ProStringList &tmp = project->values(ProKey(comp + ".input"));
                for (ProStringList::ConstIterator it = tmp.begin(); it != tmp.end(); ++it) {
                    const ProStringList &inputs = project->values((*it).toKey());
                    for (ProStringList::ConstIterator input = inputs.begin(); input != inputs.end(); ++input) {
                        if((*input).isEmpty())
                            continue;
                        QString inpf = (*input).toQString();
                        QString in = fileFixify(inpf);
                        if(in == file) {
                            bool pass = project->test(verify.toKey(),
                                                      QList<ProStringList>() << ProStringList(replaceExtraCompilerVariables(tmp_out.toQString(), inpf, QString(), NoShell)) <<
                                                      ProStringList(file));
                            if(invert)
                                pass = !pass;
                            if(!pass)
                                return false;
                            break;
                        }
                    }
                }
            }
        }
    } else if (config.indexOf("verify") != -1) {
        QString tmp_out = project->first(ProKey(comp + ".output")).toQString();
        if(tmp_out.isEmpty())
            return false;
        const QString tmp_cmd = project->values(ProKey(comp + ".commands")).join(' ');
        if (config.indexOf("combine") != -1) {
            QString cmd = replaceExtraCompilerVariables(tmp_cmd, QString(), tmp_out, LocalShell);
            if(system(cmd.toLatin1().constData()))
                return false;
        } else {
            const ProStringList &tmp = project->values(ProKey(comp + ".input"));
            for (ProStringList::ConstIterator it = tmp.begin(); it != tmp.end(); ++it) {
                const ProStringList &inputs = project->values((*it).toKey());
                for (ProStringList::ConstIterator input = inputs.begin(); input != inputs.end(); ++input) {
                    if((*input).isEmpty())
                        continue;
                    QString inpf = (*input).toQString();
                    QString in = fileFixify(inpf);
                    if(in == file) {
                        QString out = replaceExtraCompilerVariables(tmp_out, inpf, QString(), NoShell);
                        QString cmd = replaceExtraCompilerVariables(tmp_cmd, in, out, LocalShell);
                        if(system(cmd.toLatin1().constData()))
                            return false;
                        break;
                    }
                }
            }
        }
    }
    return true;
}